

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_add_ping(nghttp2_session *session,uint8_t flags,uint8_t *opaque_data)

{
  nghttp2_outbound_item *item_00;
  nghttp2_mem *mem;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  uint8_t *opaque_data_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  if (((flags & 1) == 0) || (session->obq_flood_counter_ < session->max_outbound_ack)) {
    item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0x98);
    if (item_00 == (nghttp2_outbound_item *)0x0) {
      session_local._4_4_ = -0x385;
    }
    else {
      nghttp2_outbound_item_init(item_00);
      nghttp2_frame_ping_init((nghttp2_ping *)item_00,flags,opaque_data);
      session_local._4_4_ = nghttp2_session_add_item(session,item_00);
      if (session_local._4_4_ == 0) {
        if ((flags & 1) != 0) {
          session->obq_flood_counter_ = session->obq_flood_counter_ + 1;
        }
        session_local._4_4_ = 0;
      }
      else {
        nghttp2_frame_ping_free((nghttp2_ping *)item_00);
        nghttp2_mem_free(&session->mem,item_00);
      }
    }
  }
  else {
    session_local._4_4_ = -0x388;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_add_ping(nghttp2_session *session, uint8_t flags,
                             const uint8_t *opaque_data) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_mem *mem;

  mem = &session->mem;

  if ((flags & NGHTTP2_FLAG_ACK) &&
      session->obq_flood_counter_ >= session->max_outbound_ack) {
    return NGHTTP2_ERR_FLOODED;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_ping_init(&frame->ping, flags, opaque_data);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_ping_free(&frame->ping);
    nghttp2_mem_free(mem, item);
    return rv;
  }

  if (flags & NGHTTP2_FLAG_ACK) {
    ++session->obq_flood_counter_;
  }

  return 0;
}